

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlParserInputBufferGrow(xmlParserInputBufferPtr in,int len)

{
  void *pvVar1;
  xmlInputReadCallback p_Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  xmlBufPtr pxVar7;
  xmlChar *pxVar8;
  uint uVar9;
  xmlBufPtr *ppxVar10;
  size_t sizeOut;
  ulong local_38;
  
  if (in == (xmlParserInputBufferPtr)0x0) {
    return -1;
  }
  if (in->error != 0) {
    return -1;
  }
  uVar9 = 4000;
  if (4000 < len) {
    uVar9 = len;
  }
  if (in->readcallback == (xmlInputReadCallback)0x0) {
    uVar5 = 0;
    goto LAB_0015efd9;
  }
  if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
    ppxVar10 = &in->buffer;
LAB_0015ef55:
    pxVar7 = *ppxVar10;
    iVar4 = xmlBufGrow(pxVar7,(ulong)uVar9);
    iVar6 = 2;
    if (iVar4 < 0) {
      uVar5 = 0;
      goto LAB_0015efcc;
    }
    pvVar1 = in->context;
    p_Var2 = in->readcallback;
    pxVar8 = xmlBufEnd(pxVar7);
    uVar5 = (*p_Var2)(pvVar1,(char *)pxVar8,uVar9);
    if ((int)uVar5 < 1) {
      in->readcallback = endOfInput;
    }
    if ((int)uVar5 < 0) {
      iVar6 = 0x5dc;
      if (uVar5 != 0xffffffff) {
        iVar6 = -uVar5;
      }
      goto LAB_0015efcc;
    }
    iVar4 = xmlBufAddLen(pxVar7,(ulong)uVar5);
    bVar3 = true;
    iVar6 = 2;
    if (iVar4 < 0) goto LAB_0015efcc;
  }
  else {
    ppxVar10 = &in->raw;
    if (in->raw != (xmlBufPtr)0x0) goto LAB_0015ef55;
    pxVar7 = xmlBufCreate(6000);
    *ppxVar10 = pxVar7;
    if (pxVar7 != (xmlBufPtr)0x0) goto LAB_0015ef55;
    uVar5 = 0;
    iVar6 = 2;
LAB_0015efcc:
    in->error = iVar6;
    bVar3 = false;
  }
  if (!bVar3) {
    return -1;
  }
LAB_0015efd9:
  if (in->encoder != (xmlCharEncodingHandlerPtr)0x0) {
    local_38 = -(ulong)(in->readcallback != (xmlInputReadCallback)0x0) | (ulong)uVar9;
    iVar6 = xmlCharEncInput(in,&local_38);
    uVar5 = 0xffffffff;
    if (-1 < iVar6) {
      uVar5 = (uint)local_38;
    }
  }
  return uVar5;
}

Assistant:

int
xmlParserInputBufferGrow(xmlParserInputBufferPtr in, int len) {
    int res = 0;

    if ((in == NULL) || (in->error))
        return(-1);

    if (len < MINLEN)
        len = MINLEN;

    /*
     * Call the read method for this I/O type.
     */
    if (in->readcallback != NULL) {
        xmlBufPtr buf;

        if (in->encoder == NULL) {
            buf = in->buffer;
        } else {
            /*
             * Some users only set 'encoder' and expect us to create
             * the raw buffer lazily.
             */
            if (in->raw == NULL) {
                in->raw = xmlBufCreate(XML_IO_BUFFER_SIZE);
                if (in->raw == NULL) {
                    in->error = XML_ERR_NO_MEMORY;
                    return(-1);
                }
            }
            buf = in->raw;
        }

        if (xmlBufGrow(buf, len) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }

	res = in->readcallback(in->context, (char *)xmlBufEnd(buf), len);
	if (res <= 0)
	    in->readcallback = endOfInput;
        if (res < 0) {
            if (res == -1)
                in->error = XML_IO_UNKNOWN;
            else
                in->error = -res;
            return(-1);
        }

        if (xmlBufAddLen(buf, res) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }
    }

    /*
     * Handle encoding.
     */
    if (in->encoder != NULL) {
        size_t sizeOut;

        /*
         * Don't convert whole buffer when reading from memory.
         */
        if (in->readcallback == NULL)
            sizeOut = len;
        else
            sizeOut = SIZE_MAX;

	if (xmlCharEncInput(in, &sizeOut) < 0)
	    return(-1);
        res = sizeOut;
    }
    return(res);
}